

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

void lws_vhost_destroy1(lws_vhost *vh)

{
  lws_context *plVar1;
  lws_vhost *v1;
  lws_log_cx_t *cx;
  int iVar2;
  char *pcVar3;
  lws_dll2 *plVar4;
  lws_dll2 *plVar5;
  lws_vhost **pplVar6;
  
  plVar1 = vh->context;
  _lws_log_cx((vh->lc).log_cx,lws_log_prepend_vhost,vh,8,"lws_vhost_destroy1","\n");
  if ((vh->field_0x368 & 4) == 0) {
    lws_tls_session_vh_destroy(vh);
    vh->field_0x368 = vh->field_0x368 | 4;
    lws_dll2_add_tail(&vh->vh_being_destroyed_list,&plVar1->owner_vh_being_destroyed);
    plVar4 = (vh->listen_wsi).head;
LAB_00112f25:
    plVar5 = plVar4;
    if (plVar5 != (lws_dll2 *)0x0) {
      plVar4 = plVar5->next;
      pplVar6 = &plVar1->vhost_list;
      while (v1 = *pplVar6, v1 != (lws_vhost *)0x0) {
        if (((v1 != vh) && ((v1->field_0x368 & 4) == 0)) &&
           (iVar2 = lws_vhost_compare_listen(v1,vh), iVar2 != 0)) {
          cx = (vh->lc).log_cx;
          pcVar3 = lws_lc_tag(&v1->lc);
          _lws_log_cx(cx,lws_log_prepend_vhost,vh,4,"lws_vhost_destroy1","listen skt migrate -> %s",
                      pcVar3);
          lws_dll2_remove(plVar5);
          lws_dll2_add_tail(plVar5,&v1->listen_wsi);
          v1->count_bound_wsi = v1->count_bound_wsi + 1;
          __lws_vhost_unbind_wsi((lws *)&plVar5[-0x1b].next);
          lws_vhost_bind_wsi(v1,(lws *)&plVar5[-0x1b].next);
          v1->count_bound_wsi = v1->count_bound_wsi + -1;
          break;
        }
        pplVar6 = &v1->vhost_next;
      }
      goto LAB_00112f25;
    }
    plVar4 = (vh->listen_wsi).head;
    while (plVar4 != (lws_dll2 *)0x0) {
      plVar5 = plVar4->next;
      lws_dll2_remove(plVar4);
      lws_set_timeout((lws *)&plVar4[-0x1b].next,PENDING_TIMEOUT_AWAITING_PROXY_RESPONSE,-1);
      plVar4 = plVar5;
    }
  }
  return;
}

Assistant:

void
lws_vhost_destroy1(struct lws_vhost *vh)
{
	struct lws_context *context = vh->context;

	lwsl_vhost_info(vh, "\n");

	lws_context_lock(context, "vhost destroy 1"); /* ---------- context { */

	if (vh->being_destroyed)
		goto out;

	lws_vhost_lock(vh); /* -------------- vh { */

#if defined(LWS_WITH_TLS_SESSIONS) && defined(LWS_WITH_TLS)
	lws_tls_session_vh_destroy(vh);
#endif

	vh->being_destroyed = 1;
	lws_dll2_add_tail(&vh->vh_being_destroyed_list,
			  &context->owner_vh_being_destroyed);

#if defined(LWS_WITH_NETWORK) && defined(LWS_WITH_SERVER)
	/*
	 * PHASE 1: take down or reassign any listen wsi
	 *
	 * Are there other vhosts that are piggybacking on our listen sockets?
	 * If so we need to hand each listen socket off to one of the others
	 * so it will remain open.
	 *
	 * If not, close the listen socket now.
	 *
	 * Either way the listen socket response to the vhost close is
	 * immediately performed.
	 */

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
			      lws_dll2_get_head(&vh->listen_wsi)) {
		struct lws *wsi = lws_container_of(d, struct lws, listen_list);

		/*
		 * For each of our listen sockets, check every other vhost to
		 * see if another vhost should be given our listen socket.
		 *
		 * ipv4 and ipv6 sockets will both match and be migrated.
		 */

		lws_start_foreach_ll(struct lws_vhost *, v,
				     context->vhost_list) {
			if (v != vh && !v->being_destroyed &&
			    lws_vhost_compare_listen(v, vh)) {
				/*
				 * this can only be a listen wsi, which is
				 * restricted... it has no protocol or other
				 * bindings or states.  So we can simply
				 * swap it to a vhost that has the same
				 * iface + port, but is not closing.
				 */

				lwsl_vhost_notice(vh, "listen skt migrate -> %s",
						      lws_vh_tag(v));

				lws_dll2_remove(&wsi->listen_list);
				lws_dll2_add_tail(&wsi->listen_list,
						  &v->listen_wsi);

				/* req cx + vh lock */
				/*
				 * If the vhost sees it's being destroyed and
				 * in the unbind the number of wsis bound to
				 * it falls to zero, it will destroy the
				 * vhost opportunistically before we can
				 * complete the transfer.  Add a fake wsi
				 * bind temporarily to disallow this...
				 */
				v->count_bound_wsi++;
				__lws_vhost_unbind_wsi(wsi);
				lws_vhost_bind_wsi(v, wsi);
				/*
				 * ... remove the fake wsi bind
				 */
				v->count_bound_wsi--;
				break;
			}
		} lws_end_foreach_ll(v, vhost_next);

	} lws_end_foreach_dll_safe(d, d1);

	/*
	 * If any listen wsi left we couldn't pass to other vhosts, close them
	 */

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
			           lws_dll2_get_head(&vh->listen_wsi)) {
		struct lws *wsi = lws_container_of(d, struct lws, listen_list);

		lws_dll2_remove(&wsi->listen_list);
		lws_wsi_close(wsi, LWS_TO_KILL_ASYNC);

	} lws_end_foreach_dll_safe(d, d1);

#endif
#if defined(LWS_WITH_TLS_JIT_TRUST)
	lws_sul_cancel(&vh->sul_unref);
#endif

	lws_vhost_unlock(vh); /* } vh -------------- */

out:
	lws_context_unlock(context); /* --------------------------- context { */
}